

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

void SimpleBVH::point_segment_squared_distance
               (VectorMax3d *point,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *f,
               VectorMax3d *closest_point,double *dist)

{
  array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *this;
  MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *pMVar1;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *pMVar2;
  const_reference pvVar3;
  StorageBaseType *pSVar4;
  RealScalar RVar5;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_178;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_160;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_130;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
  local_100;
  double local_90;
  double lambda0;
  double lambda1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
  local_68;
  ReturnType local_50;
  double t;
  RealScalar local_30;
  double l2;
  double *dist_local;
  VectorMax3d *closest_point_local;
  array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *f_local;
  VectorMax3d *point_local;
  
  l2 = (double)dist;
  dist_local = (double *)closest_point;
  closest_point_local = f->_M_elems;
  f_local = (array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)point;
  pMVar1 = (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
           std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](f,0);
  pMVar2 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)
           std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                     ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,1);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&t,pMVar1,pMVar2);
  local_30 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
             ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                            *)&t);
  this = f_local;
  pMVar2 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)
           std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                     ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            (&local_68,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)this,pMVar2);
  pMVar1 = (MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)
           std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                     ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,1);
  pMVar2 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)
           std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                     ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
              *)&lambda1,pMVar1,pMVar2);
  local_50 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,3,1>const,Eigen::Matrix<double,-1,1,0,3,1>const>>
             ::
             dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                       ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,3,1>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                         *)&local_68,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                         *)&lambda1);
  if ((local_50 <= 0.0) || ((local_30 == 0.0 && (!NAN(local_30))))) {
    pvVar3 = std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                       ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,0);
    Eigen::Matrix<double,_-1,_1,_0,_3,_1>::operator=
              ((Matrix<double,__1,_1,_0,_3,_1> *)dist_local,pvVar3);
  }
  else if (local_50 <= local_30) {
    lambda0 = local_50 / local_30;
    local_90 = 1.0 - lambda0;
    pSVar4 = (StorageBaseType *)
             std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                       ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,0);
    Eigen::operator*(&local_130,&local_90,pSVar4);
    pSVar4 = (StorageBaseType *)
             std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                       ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,1);
    Eigen::operator*(&local_160,&lambda0,pSVar4);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,3,1>const>const,Eigen::Matrix<double,-1,1,0,3,1>const>>
    ::operator+(&local_100,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,3,1>const>const,Eigen::Matrix<double,_1,1,0,3,1>const>>
                 *)&local_130,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                 *)&local_160);
    Eigen::Matrix<double,-1,1,0,3,1>::operator=
              ((Matrix<double,_1,1,0,3,1> *)dist_local,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>_>
                *)&local_100);
  }
  else {
    pvVar3 = std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[]
                       ((array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)closest_point_local,1);
    Eigen::Matrix<double,_-1,_1,_0,_3,_1>::operator=
              ((Matrix<double,__1,_1,_0,_3,_1> *)dist_local,pvVar3);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,3,1>>::operator-
            (&local_178,(MatrixBase<Eigen::Matrix<double,_1,1,0,3,1>> *)f_local,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)dist_local);
  RVar5 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>_>
          ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                         *)&local_178);
  *(RealScalar *)l2 = RVar5;
  return;
}

Assistant:

void point_segment_squared_distance(
    const VectorMax3d& point,
    const std::array<VectorMax3d, 2>& f,
    VectorMax3d& closest_point,
    double& dist)
{
    const double l2 = (f[0] - f[1]).squaredNorm();
    const double t = (point - f[0]).dot(f[1] - f[0]);
    if (t <= 0.0 || l2 == 0.0) {
        closest_point = f[0];
    } else if (t > l2) {
        closest_point = f[1];
    } else {
        const double lambda1 = t / l2;
        const double lambda0 = 1.0 - lambda1;
        closest_point = lambda0 * f[0] + lambda1 * f[1];
    }
    dist = (point - closest_point).squaredNorm();
}